

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

int predict_skip_txfm(MACROBLOCK *x,BLOCK_SIZE bsize,int64_t *dist,int reduced_tx_set)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  int16_t iVar6;
  int16_t iVar7;
  uint diff_stride;
  int64_t iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  undefined7 in_register_00000031;
  int col;
  long lVar16;
  uint uVar17;
  TxfmParam param;
  tran_low_t coefs [1024];
  int16_t *local_10b0;
  TxfmParam local_1080;
  long local_1068;
  int local_1060 [1036];
  
  uVar9 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  diff_stride = (uint)block_size_wide[uVar9];
  bVar1 = block_size_high[uVar9];
  iVar6 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
  iVar8 = av1_pixel_diff_dist(x,0,0,0,bsize,bsize,(uint *)0x0);
  *dist = iVar8;
  lVar12 = (long)(short)((uint)(int)iVar6 >> 3);
  uVar13 = (ulong)(lVar12 * lVar12) >> 3;
  if ((x->txfm_search_params).skip_txfm_level < 2) {
    if ((long)uVar13 < (iVar8 / (long)(ulong)diff_stride) / (long)(ulong)(uint)bVar1) {
LAB_00237fba:
      bVar5 = false;
    }
    else {
      local_1080.tx_size = ""[uVar9];
      uVar13 = (ulong)local_1080.tx_size;
      iVar2 = tx_size_high[local_1080.tx_size];
      local_1068 = (long)tx_size_wide[local_1080.tx_size];
      local_1080.tx_type = '\0';
      local_1080.bd = (x->e_mbd).bd;
      local_1080.is_hbd = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
      local_1080.lossless = 0;
      pMVar4 = *(x->e_mbd).mi;
      uVar17 = 1;
      if ((pMVar4->field_0xa7 & 0x80) == 0) {
        uVar17 = (uint)('\0' < pMVar4->ref_frame[0]);
      }
      iVar11 = 0;
      uVar14 = 0;
      if (((0x61810UL >> (uVar13 & 0x3f) & 1) == 0) &&
         (uVar14 = uVar17, (0x18608UL >> (uVar13 & 0x3f) & 1) == 0)) {
        if (reduced_tx_set == 0) {
          uVar14 = (uint)av1_ext_tx_set_lookup[0]
                         [(ulong)((0x60604UL >> (uVar13 & 0x3f) & 1) != 0) + (ulong)(uVar17 * 2)];
        }
        else {
          uVar14 = (uint)(byte)((uVar17 == 0) + 1);
        }
      }
      local_1080.tx_set_type = (TxSetType)uVar14;
      lVar12 = 0;
      if (local_1080.bd != AOM_BITS_8) {
        lVar12 = (ulong)(local_1080.bd != AOM_BITS_10) + 1;
      }
      uVar3 = skip_pred_threshold[lVar12][uVar9];
      local_10b0 = x->plane[0].src_diff;
      uVar17 = tx_size_wide[local_1080.tx_size] * iVar2;
      iVar7 = av1_ac_quant_QTX(x->qindex,0,local_1080.bd);
      lVar12 = local_1068;
      do {
        lVar16 = 0;
        do {
          av1_fwd_txfm(local_10b0 + lVar16,local_1060,diff_stride,&local_1080);
          iVar10 = -local_1060[0];
          if (0 < local_1060[0]) {
            iVar10 = local_1060[0];
          }
          if ((int)iVar6 * uVar3 <= (uint)(iVar10 << 7)) goto LAB_00237fba;
          if (1 < (int)uVar17) {
            uVar9 = 1;
            do {
              iVar10 = local_1060[uVar9];
              iVar15 = -iVar10;
              if (0 < iVar10) {
                iVar15 = iVar10;
              }
              if ((int)iVar7 * uVar3 <= (uint)(iVar15 << 7)) goto LAB_00237fba;
              uVar9 = uVar9 + 1;
            } while (uVar17 != uVar9);
          }
          lVar16 = lVar16 + lVar12;
        } while (lVar16 < (long)(ulong)diff_stride);
        local_10b0 = local_10b0 + (ulong)diff_stride * (long)iVar2;
        iVar11 = iVar11 + iVar2;
      } while (iVar11 < (int)(uint)bVar1);
      bVar5 = true;
    }
  }
  else {
    bVar5 = iVar8 <= (long)uVar13;
  }
  return (int)bVar5;
}

Assistant:

static int predict_skip_txfm(MACROBLOCK *x, BLOCK_SIZE bsize, int64_t *dist,
                             int reduced_tx_set) {
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const MACROBLOCKD *xd = &x->e_mbd;
  const int16_t dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd);

  *dist = av1_pixel_diff_dist(x, 0, 0, 0, bsize, bsize, NULL);

  const int64_t mse = *dist / bw / bh;
  // Normalized quantizer takes the transform upscaling factor (8 for tx size
  // smaller than 32) into account.
  const int16_t normalized_dc_q = dc_q >> 3;
  const int64_t mse_thresh = (int64_t)normalized_dc_q * normalized_dc_q / 8;
  // For faster early skip decision, use dist to compare against threshold so
  // that quality risk is less for the skip=1 decision. Otherwise, use mse
  // since the fwd_txfm coeff checks will take care of quality
  // TODO(any): Use dist to return 0 when skip_txfm_level is 1
  int64_t pred_err = (txfm_params->skip_txfm_level >= 2) ? *dist : mse;
  // Predict not to skip when error is larger than threshold.
  if (pred_err > mse_thresh) return 0;
  // Return as skip otherwise for aggressive early skip
  else if (txfm_params->skip_txfm_level >= 2)
    return 1;

  const int max_tx_size = max_predict_sf_tx_size[bsize];
  const int tx_h = tx_size_high[max_tx_size];
  const int tx_w = tx_size_wide[max_tx_size];
  DECLARE_ALIGNED(32, tran_low_t, coefs[32 * 32]);
  TxfmParam param;
  param.tx_type = DCT_DCT;
  param.tx_size = max_tx_size;
  param.bd = xd->bd;
  param.is_hbd = is_cur_buf_hbd(xd);
  param.lossless = 0;
  param.tx_set_type = av1_get_ext_tx_set_type(
      param.tx_size, is_inter_block(xd->mi[0]), reduced_tx_set);
  const int bd_idx = (xd->bd == 8) ? 0 : ((xd->bd == 10) ? 1 : 2);
  const uint32_t max_qcoef_thresh = skip_pred_threshold[bd_idx][bsize];
  const int16_t *src_diff = x->plane[0].src_diff;
  const int n_coeff = tx_w * tx_h;
  const int16_t ac_q = av1_ac_quant_QTX(x->qindex, 0, xd->bd);
  const uint32_t dc_thresh = max_qcoef_thresh * dc_q;
  const uint32_t ac_thresh = max_qcoef_thresh * ac_q;
  for (int row = 0; row < bh; row += tx_h) {
    for (int col = 0; col < bw; col += tx_w) {
      av1_fwd_txfm(src_diff + col, coefs, bw, &param);
      // Operating on TX domain, not pixels; we want the QTX quantizers
      const uint32_t dc_coef = (((uint32_t)abs(coefs[0])) << 7);
      if (dc_coef >= dc_thresh) return 0;
      for (int i = 1; i < n_coeff; ++i) {
        const uint32_t ac_coef = (((uint32_t)abs(coefs[i])) << 7);
        if (ac_coef >= ac_thresh) return 0;
      }
    }
    src_diff += tx_h * bw;
  }
  return 1;
}